

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O3

void __thiscall
HighsDomain::computeMinActivity
          (HighsDomain *this,HighsInt start,HighsInt end,HighsInt *ARindex,double *ARvalue,
          HighsInt *ninfmin,HighsCDouble *activitymin)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  pointer pdVar4;
  pointer piVar5;
  pointer piVar6;
  pointer pdVar7;
  pointer ppVar8;
  int *piVar9;
  int iVar10;
  long lVar11;
  pointer ppVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  
  bVar1 = this->infeasible_;
  activitymin->hi = 0.0;
  activitymin->lo = 0.0;
  *ninfmin = 0;
  dVar13 = 0.0;
  if (bVar1 == true) {
    if (end != start) {
      pdVar4 = (this->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar5 = (this->colLowerPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar6 = (this->colUpperPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (this->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar11 = (long)start;
      iVar10 = 0;
      dVar15 = 0.0;
      do {
        iVar2 = ARindex[lVar11];
        ppVar12 = (pointer)(pdVar4 + iVar2);
        piVar9 = piVar5 + iVar2;
        ppVar8 = (this->prevboundval_).
                 super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        while( true ) {
          iVar3 = *piVar9;
          if ((iVar3 < this->infeasible_pos) &&
             (((dVar14 = ppVar12->first, iVar3 == -1 || (ppVar8[iVar3].first != dVar14)) ||
              (NAN(ppVar8[iVar3].first) || NAN(dVar14))))) break;
          ppVar12 = ppVar8 + iVar3;
          piVar9 = &ppVar8[iVar3].second;
        }
        ppVar12 = (pointer)(pdVar7 + iVar2);
        piVar9 = piVar6 + iVar2;
        while( true ) {
          iVar2 = *piVar9;
          if ((iVar2 < this->infeasible_pos) &&
             (((dVar16 = ppVar12->first, iVar2 == -1 || (ppVar8[iVar2].first != dVar16)) ||
              (NAN(ppVar8[iVar2].first) || NAN(dVar16))))) break;
          ppVar12 = ppVar8 + iVar2;
          piVar9 = &ppVar8[iVar2].second;
        }
        if (0.0 <= ARvalue[lVar11]) {
          dVar16 = dVar14;
          if (-INFINITY < dVar14) goto LAB_002911c3;
LAB_002911cd:
          iVar10 = iVar10 + 1;
          *ninfmin = iVar10;
          dVar14 = dVar15;
        }
        else {
          if (INFINITY <= dVar16) goto LAB_002911cd;
LAB_002911c3:
          dVar16 = ARvalue[lVar11] * dVar16;
          if (dVar16 <= -INFINITY) goto LAB_002911cd;
          dVar14 = dVar16 + dVar15;
          activitymin->hi = dVar14;
          dVar13 = dVar13 + (dVar15 - (dVar14 - dVar16)) + (dVar16 - (dVar14 - (dVar14 - dVar16)));
          activitymin->lo = dVar13;
        }
        lVar11 = lVar11 + 1;
        dVar15 = dVar14;
      } while ((int)lVar11 != end);
    }
  }
  else if (end != start) {
    pdVar4 = (this->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (this->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar11 = 0;
    iVar10 = 0;
    dVar15 = 0.0;
    do {
      if (0.0 <= ARvalue[start + lVar11]) {
        dVar14 = pdVar4[ARindex[start + lVar11]];
        if (-INFINITY < dVar14) goto LAB_002912c4;
LAB_002912ce:
        iVar10 = iVar10 + 1;
        *ninfmin = iVar10;
        dVar16 = dVar15;
      }
      else {
        dVar14 = pdVar7[ARindex[start + lVar11]];
        if (INFINITY <= dVar14) goto LAB_002912ce;
LAB_002912c4:
        dVar14 = ARvalue[start + lVar11] * dVar14;
        if (dVar14 <= -INFINITY) goto LAB_002912ce;
        dVar16 = dVar14 + dVar15;
        activitymin->hi = dVar16;
        dVar13 = dVar13 + (dVar15 - (dVar16 - dVar14)) + (dVar14 - (dVar16 - (dVar16 - dVar14)));
        activitymin->lo = dVar13;
      }
      lVar11 = lVar11 + 1;
      dVar15 = dVar16;
    } while (end - start != (int)lVar11);
  }
  dVar15 = activitymin->hi;
  dVar14 = dVar15 + dVar13;
  activitymin->hi = dVar14;
  activitymin->lo = (dVar13 - (dVar14 - dVar15)) + (dVar15 - (dVar14 - (dVar14 - dVar15)));
  return;
}

Assistant:

void HighsDomain::computeMinActivity(HighsInt start, HighsInt end,
                                     const HighsInt* ARindex,
                                     const double* ARvalue, HighsInt& ninfmin,
                                     HighsCDouble& activitymin) {
  if (infeasible_) {
    activitymin = 0.0;
    ninfmin = 0;
    for (HighsInt j = start; j != end; ++j) {
      HighsInt col = ARindex[j];
      double val = ARvalue[j];

      assert(col < int(col_lower_.size()));

      HighsInt tmp;
      double lb = getColLowerPos(col, infeasible_pos - 1, tmp);
      double ub = getColUpperPos(col, infeasible_pos - 1, tmp);
      double contributionmin = activityContributionMin(val, lb, ub);

      if (contributionmin == -kHighsInf)
        ++ninfmin;
      else
        activitymin += contributionmin;
    }

  } else {
    activitymin = 0.0;
    ninfmin = 0;
    for (HighsInt j = start; j != end; ++j) {
      HighsInt col = ARindex[j];
      double val = ARvalue[j];

      assert(col < int(col_lower_.size()));

      double contributionmin =
          activityContributionMin(val, col_lower_[col], col_upper_[col]);

      if (contributionmin == -kHighsInf)
        ++ninfmin;
      else
        activitymin += contributionmin;
    }
  }
  activitymin.renormalize();
}